

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceReleaseQueue.hpp
# Opt level: O1

void __thiscall
Diligent::ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper>::SafeReleaseResource
          (ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper> *this,
          DynamicStaleResourceWrapper *Wrapper,Uint64 NextCommandListNumber)

{
  _Elt_pointer ppVar1;
  int iVar2;
  Uint64 local_20;
  
  local_20 = NextCommandListNumber;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->m_StaleObjectsMutex);
  if (iVar2 == 0) {
    ppVar1 = (this->m_StaleResources).
             super__Deque_base<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::STDAllocator<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::IMemoryAllocator>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVar1 == (this->m_StaleResources).
                  super__Deque_base<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::STDAllocator<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::IMemoryAllocator>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::
      deque<std::pair<unsigned_long,Diligent::DynamicStaleResourceWrapper>,Diligent::STDAllocator<std::pair<unsigned_long,Diligent::DynamicStaleResourceWrapper>,Diligent::IMemoryAllocator>>
      ::_M_push_back_aux<unsigned_long&,Diligent::DynamicStaleResourceWrapper_const&>
                ((deque<std::pair<unsigned_long,Diligent::DynamicStaleResourceWrapper>,Diligent::STDAllocator<std::pair<unsigned_long,Diligent::DynamicStaleResourceWrapper>,Diligent::IMemoryAllocator>>
                  *)&this->m_StaleResources,&local_20,Wrapper);
    }
    else {
      ppVar1->first = local_20;
      (ppVar1->second).m_pStaleResource = Wrapper->m_pStaleResource;
      (this->m_StaleResources).
      super__Deque_base<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::STDAllocator<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::IMemoryAllocator>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar1 + 1;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_StaleObjectsMutex);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void SafeReleaseResource(const ResourceWrapperType& Wrapper, Uint64 NextCommandListNumber)
    {
        std::lock_guard<std::mutex> LockGuard(m_StaleObjectsMutex);
        m_StaleResources.emplace_back(NextCommandListNumber, Wrapper);
    }